

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_tools.h
# Opt level: O0

void __thiscall
ncnn::SafeOrderList<ncnn::ObjectBox>::remove_all_match<ncnn::ObjectBoxNmsCondition>
          (SafeOrderList<ncnn::ObjectBox> *this,ObjectBoxNmsCondition match)

{
  bool bVar1;
  undefined1 uVar2;
  const_iterator in_RDI;
  Iterator iter;
  MutexLockGuard guard;
  Mutex *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  _Self in_stack_ffffffffffffffa0;
  iterator local_50;
  _List_const_iterator<ncnn::ObjectBox> local_48 [3];
  _Self local_30;
  _Self local_28 [5];
  
  MutexLockGuard::MutexLockGuard
            ((MutexLockGuard *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  local_28[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::begin
                 ((list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)
                  in_stack_ffffffffffffff88);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::end
                   ((list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)
                    in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(local_28,&local_30);
    if (!bVar1) break;
    std::_List_iterator<ncnn::ObjectBox>::operator*((_List_iterator<ncnn::ObjectBox> *)0x1cadbc);
    uVar2 = ObjectBoxNmsCondition::operator()
                      ((ObjectBoxNmsCondition *)in_stack_ffffffffffffffa0._M_node,
                       (ObjectBox *)in_RDI._M_node);
    if ((bool)uVar2) {
      local_50._M_node =
           (_List_node_base *)std::_List_iterator<ncnn::ObjectBox>::operator++(local_28,0);
      std::_List_const_iterator<ncnn::ObjectBox>::_List_const_iterator(local_48,&local_50);
      std::__cxx11::list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::erase
                ((list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)
                 CONCAT17(uVar2,in_stack_ffffffffffffff90),in_RDI);
    }
    else {
      in_stack_ffffffffffffffa0 = std::_List_iterator<ncnn::ObjectBox>::operator++(local_28,0);
    }
  }
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x1cae49);
  return;
}

Assistant:

void remove_all_match(MatchFun match)
  {
    MutexLockGuard guard(mutex);
    Iterator iter = container.begin();
    for (; iter != container.end();)
    {
      if (match(*iter))
        container.erase(iter++);
      else
        iter++;
    }
  }